

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

S390CPU * cpu_s390_init(uc_struct_conflict14 *uc,char *cpu_model)

{
  CPUClass *k;
  CPUClass *cc;
  CPUState *cs;
  S390CPU *cpu;
  char *cpu_model_local;
  uc_struct_conflict14 *uc_local;
  
  uc_local = (uc_struct_conflict14 *)calloc(1,0x92e0);
  if ((CPUState *)uc_local == (CPUState *)0x0) {
    uc_local = (uc_struct_conflict14 *)0x0;
  }
  else {
    if (uc->cpu_model == 0x7fffffff) {
      uc->cpu_model = 0x24;
    }
    else if (0x25 < uc->cpu_model) {
      free(uc_local);
      return (S390CPU *)0x0;
    }
    k = (CPUClass *)(((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0x1dc);
    ((CPUState *)uc_local)->cc = k;
    ((CPUState *)uc_local)->uc = (uc_struct_conflict7 *)uc;
    uc->cpu = (CPUState *)uc_local;
    cpu_class_init((uc_struct *)uc,k);
    s390_cpu_class_init(uc,k);
    s390_skeys_init((uc_struct *)uc);
    s390_init_cpu_model((uc_struct *)uc,uc->cpu_model);
    cpu_common_initfn((uc_struct *)uc,(CPUState *)uc_local);
    s390_cpu_initfn(uc,(CPUState *)uc_local);
    s390_cpu_realizefn(uc,(CPUState *)uc_local);
    cpu_address_space_init_s390x
              ((CPUState *)uc_local,0,(MemoryRegion_conflict *)((CPUState *)uc_local)->memory);
  }
  return (S390CPU *)uc_local;
}

Assistant:

S390CPU *cpu_s390_init(struct uc_struct *uc, const char *cpu_model)
{
    S390CPU *cpu;
    CPUState *cs;
    CPUClass *cc;
    // int i;

    cpu = calloc(1, sizeof(*cpu));
    if (cpu == NULL) {
        return NULL;
    }

    if (uc->cpu_model == INT_MAX) {
        uc->cpu_model = UC_CPU_S390X_QEMU; // qemu-s390x-cpu
    } else if (uc->cpu_model > UC_CPU_S390X_MAX) {
        free(cpu);
        return NULL;
    }

    cs = (CPUState *)cpu;
    cc = (CPUClass *)&cpu->cc;
    cs->cc = cc;
    cs->uc = uc;
    uc->cpu = (CPUState *)cpu;

    /* init CPUClass */
    cpu_class_init(uc, cc);

    /* init CPUClass */
    s390_cpu_class_init(uc, cc);

    // init skeys
    s390_skeys_init(uc);

    // init s390 models
    s390_init_cpu_model(uc, uc->cpu_model);

    /* init CPUState */
    cpu_common_initfn(uc, cs);

    /* init CPU */
    s390_cpu_initfn(uc, cs);

    /* realize CPU */
    s390_cpu_realizefn(uc, cs);

    // init addresss space
    cpu_address_space_init(cs, 0, cs->memory);

    //qemu_init_vcpu(cs);

    return cpu;
}